

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O0

void __thiscall
Catch::anon_unknown_26::TestGroup::TestGroup
          (TestGroup *this,IEventListenerPtr *reporter,Config *config)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  IEventListener *pIVar5;
  undefined4 extraout_var;
  vectorStrings *this_00;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *testCases;
  undefined4 extraout_var_00;
  TestCaseInfo *this_01;
  size_t in_R8;
  pair<std::_Rb_tree_const_iterator<const_Catch::TestCaseHandle_*>,_bool> pVar6;
  set<const_Catch::TestCaseHandle_*,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
  local_f0;
  TestCaseHandle **local_c0;
  __normal_iterator<const_Catch::TestCaseHandle_*const_*,_std::vector<const_Catch::TestCaseHandle_*,_std::allocator<const_Catch::TestCaseHandle_*>_>_>
  local_b8;
  reference local_b0;
  FilterMatch *match;
  iterator __end3_1;
  iterator __begin3_1;
  Matches *__range3_1;
  _Base_ptr local_78;
  undefined1 local_70;
  reference local_68;
  reference local_60;
  TestCaseHandle *test;
  const_iterator __end3;
  const_iterator __begin3;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *__range3;
  TestSpec *testSpec;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *allTestCases;
  Config *config_local;
  IEventListenerPtr *reporter_local;
  TestGroup *this_local;
  
  pIVar5 = Detail::unique_ptr<Catch::IEventListener>::get(reporter);
  this->m_reporter = pIVar5;
  this->m_config = config;
  RunContext::RunContext(&this->m_context,&config->super_IConfig,reporter);
  std::
  set<const_Catch::TestCaseHandle_*,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
  ::set(&this->m_tests);
  std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::vector
            (&this->m_matches);
  this->m_unmatchedTestSpecs = false;
  iVar2 = (*(this->m_config->super_IConfig)._vptr_IConfig[0xd])();
  this_00 = TestSpec::getInvalidSpecs_abi_cxx11_((TestSpec *)CONCAT44(extraout_var,iVar2));
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(this_00);
  if (bVar1) {
    testCases = getAllTestCasesSorted(&this->m_config->super_IConfig);
    iVar2 = (*(this->m_config->super_IConfig)._vptr_IConfig[0xd])();
    bVar1 = TestSpec::hasFilters((TestSpec *)CONCAT44(extraout_var_00,iVar2));
    if (bVar1) {
      TestSpec::matchesByFilter
                ((Matches *)&__range3_1,(TestSpec *)CONCAT44(extraout_var_00,iVar2),testCases,
                 &this->m_config->super_IConfig);
      std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::
      operator=(&this->m_matches,
                (vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
                 *)&__range3_1);
      std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::
      ~vector((vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_> *
              )&__range3_1);
      __end3_1 = std::
                 vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
                 ::begin(&this->m_matches);
      match = (FilterMatch *)
              std::
              vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::
              end(&this->m_matches);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3_1,
                                (__normal_iterator<Catch::TestSpec::FilterMatch_*,_std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>_>
                                 *)&match), bVar1) {
        local_b0 = __gnu_cxx::
                   __normal_iterator<Catch::TestSpec::FilterMatch_*,_std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>_>
                   ::operator*(&__end3_1);
        local_b8._M_current =
             (TestCaseHandle **)
             std::
             vector<const_Catch::TestCaseHandle_*,_std::allocator<const_Catch::TestCaseHandle_*>_>::
             begin(&local_b0->tests);
        local_c0 = (TestCaseHandle **)
                   std::
                   vector<const_Catch::TestCaseHandle_*,_std::allocator<const_Catch::TestCaseHandle_*>_>
                   ::end(&local_b0->tests);
        std::
        set<Catch::TestCaseHandle_const*,std::less<Catch::TestCaseHandle_const*>,std::allocator<Catch::TestCaseHandle_const*>>
        ::
        insert<__gnu_cxx::__normal_iterator<Catch::TestCaseHandle_const*const*,std::vector<Catch::TestCaseHandle_const*,std::allocator<Catch::TestCaseHandle_const*>>>>
                  ((set<Catch::TestCaseHandle_const*,std::less<Catch::TestCaseHandle_const*>,std::allocator<Catch::TestCaseHandle_const*>>
                    *)&this->m_tests,local_b8,
                   (__normal_iterator<const_Catch::TestCaseHandle_*const_*,_std::vector<const_Catch::TestCaseHandle_*,_std::allocator<const_Catch::TestCaseHandle_*>_>_>
                    )local_c0);
        __gnu_cxx::
        __normal_iterator<Catch::TestSpec::FilterMatch_*,_std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>_>
        ::operator++(&__end3_1);
      }
    }
    else {
      __end3 = std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::begin
                         (testCases);
      test = (TestCaseHandle *)
             std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::end
                       (testCases);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<const_Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
                                         *)&test), bVar1) {
        local_60 = __gnu_cxx::
                   __normal_iterator<const_Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
                   ::operator*(&__end3);
        this_01 = TestCaseHandle::getTestCaseInfo(local_60);
        bVar1 = TestCaseInfo::isHidden(this_01);
        if (!bVar1) {
          local_68 = local_60;
          pVar6 = std::
                  set<Catch::TestCaseHandle_const*,std::less<Catch::TestCaseHandle_const*>,std::allocator<Catch::TestCaseHandle_const*>>
                  ::emplace<Catch::TestCaseHandle_const*>
                            ((set<Catch::TestCaseHandle_const*,std::less<Catch::TestCaseHandle_const*>,std::allocator<Catch::TestCaseHandle_const*>>
                              *)&this->m_tests,&local_68);
          local_78 = (_Base_ptr)pVar6.first._M_node;
          local_70 = pVar6.second;
        }
        __gnu_cxx::
        __normal_iterator<const_Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
        ::operator++(&__end3);
      }
    }
    uVar3 = (*(this->m_config->super_IConfig)._vptr_IConfig[0x12])();
    uVar4 = (*(this->m_config->super_IConfig)._vptr_IConfig[0x13])();
    createShard<std::set<Catch::TestCaseHandle_const*,std::less<Catch::TestCaseHandle_const*>,std::allocator<Catch::TestCaseHandle_const*>>>
              (&local_f0,(Catch *)&this->m_tests,
               (set<const_Catch::TestCaseHandle_*,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
                *)(ulong)uVar3,(ulong)uVar4,in_R8);
    std::
    set<const_Catch::TestCaseHandle_*,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
    ::operator=(&this->m_tests,&local_f0);
    std::
    set<const_Catch::TestCaseHandle_*,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
    ::~set(&local_f0);
    return;
  }
  __assert_fail("m_config->testSpec().getInvalidSpecs().empty() && \"Invalid test specs should be handled before running tests\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/jbaldwin[P]libcappuccino/test/catch.cpp"
                ,0x434,
                "Catch::(anonymous namespace)::TestGroup::TestGroup(IEventListenerPtr &&, const Config *)"
               );
}

Assistant:

explicit TestGroup(IEventListenerPtr&& reporter, Config const* config):
                m_reporter(reporter.get()),
                m_config{config},
                m_context{config, CATCH_MOVE(reporter)} {

                assert( m_config->testSpec().getInvalidSpecs().empty() &&
                        "Invalid test specs should be handled before running tests" );

                auto const& allTestCases = getAllTestCasesSorted(*m_config);
                auto const& testSpec = m_config->testSpec();
                if ( !testSpec.hasFilters() ) {
                    for ( auto const& test : allTestCases ) {
                        if ( !test.getTestCaseInfo().isHidden() ) {
                            m_tests.emplace( &test );
                        }
                    }
                } else {
                    m_matches =
                        testSpec.matchesByFilter( allTestCases, *m_config );
                    for ( auto const& match : m_matches ) {
                        m_tests.insert( match.tests.begin(),
                                        match.tests.end() );
                    }
                }

                m_tests = createShard(m_tests, m_config->shardCount(), m_config->shardIndex());
            }